

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

void __thiscall
t_js_generator::generate_serialize_field
          (t_js_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  t_type *ttype;
  ostream *poVar4;
  undefined4 extraout_var;
  runtime_error *prVar5;
  t_struct *tstruct;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  t_base_type *this_01;
  undefined1 auVar7 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string name;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar3 != '\0') {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_d0,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(&name,&local_d0,&tfield->name_);
    std::runtime_error::runtime_error(prVar5,(string *)&name);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar3 == '\0')) {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if (((char)iVar3 == '\0') &&
         (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar3 == '\0')) {
        pcVar1 = (prefix->_M_dataplus)._M_p;
        pcVar2 = (tfield->name_)._M_dataplus._M_p;
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",pcVar1,pcVar2,
               *(undefined8 *)CONCAT44(extraout_var,iVar3));
        return;
      }
      std::__cxx11::string::string((string *)&name,(string *)&tfield->name_);
      if (prefix->_M_string_length != 0) {
        std::operator+(&local_d0,prefix,&tfield->name_);
        std::__cxx11::string::operator=((string *)&name,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::operator<<(poVar4,"output.");
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
        if ((char)iVar3 != '\0') {
          poVar4 = std::operator<<(out,"writeI32(");
          poVar4 = std::operator<<(poVar4,(string *)&name);
          std::operator<<(poVar4,")");
        }
      }
      else {
        this_01 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
        switch(this_01) {
        case (t_base_type *)0x0:
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_d0,"compiler error: cannot serialize void field in a struct: ",&name
                        );
          std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        case (t_base_type *)0x1:
          iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
          pcVar6 = "writeString(";
          if ((char)iVar3 != '\0') {
            pcVar6 = "writeBinary(";
          }
          break;
        case (t_base_type *)0x2:
          pcVar6 = "writeBool(";
          break;
        case (t_base_type *)0x3:
          pcVar6 = "writeByte(";
          break;
        case (t_base_type *)0x4:
          pcVar6 = "writeI16(";
          break;
        case (t_base_type *)0x5:
          pcVar6 = "writeI32(";
          break;
        case (t_base_type *)0x6:
          pcVar6 = "writeI64(";
          break;
        case (t_base_type *)0x7:
          pcVar6 = "writeDouble(";
          break;
        default:
          auVar7 = __cxa_allocate_exception(0x10);
          t_base_type::t_base_name_abi_cxx11_(&local_90,this_01,auVar7._8_4_);
          std::operator+(&local_d0,"compiler error: no JS name for base type ",&local_90);
          std::runtime_error::runtime_error(auVar7._0_8_,(string *)&local_d0);
          __cxa_throw(auVar7._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
          ;
        }
        poVar4 = std::operator<<(out,pcVar6);
        poVar4 = std::operator<<(poVar4,(string *)&name);
        std::operator<<(poVar4,")");
      }
      poVar4 = std::operator<<(out,";");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      this_00 = &name;
    }
    else {
      std::operator+(&local_70,prefix,&tfield->name_);
      generate_serialize_container(this,out,ttype,&local_70);
      this_00 = &local_70;
    }
  }
  else {
    std::operator+(&local_50,prefix,&tfield->name_);
    generate_serialize_struct(this,out,tstruct,&local_50);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void t_js_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw std::runtime_error("CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name());
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + tfield->get_name());
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + tfield->get_name());
  } else if (type->is_base_type() || type->is_enum()) {

    string name = tfield->get_name();

    // Hack for when prefix is defined (always a hash ref)
    if (!prefix.empty())
      name = prefix + tfield->get_name();

    indent(out) << "output.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw std::runtime_error("compiler error: cannot serialize void field in a struct: " + name);
        break;
      case t_base_type::TYPE_STRING:
        out << (type->is_binary() ? "writeBinary(" : "writeString(") << name << ")";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ")";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ")";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ")";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ")";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ")";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ")";
        break;
      default:
        throw std::runtime_error("compiler error: no JS name for base type " + t_base_type::t_base_name(tbase));
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ")";
    }
    out << ";" << endl;

  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}